

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void chacha20_encrypt(chacha20 *ctx,uchar *blk,int len)

{
  int iVar1;
  int local_1c;
  byte *pbStack_18;
  int len_local;
  uchar *blk_local;
  chacha20 *ctx_local;
  
  local_1c = len;
  pbStack_18 = blk;
  while (local_1c != 0) {
    if (0x3f < ctx->currentIndex) {
      chacha20_round(ctx);
    }
    for (; ctx->currentIndex < 0x40 && local_1c != 0; local_1c = local_1c + -1) {
      iVar1 = ctx->currentIndex;
      ctx->currentIndex = iVar1 + 1;
      *pbStack_18 = *pbStack_18 ^ ctx->current[iVar1];
      pbStack_18 = pbStack_18 + 1;
    }
  }
  return;
}

Assistant:

static void chacha20_encrypt(struct chacha20 *ctx, unsigned char *blk, int len)
{
    while (len) {
        /* If we don't have any state left, then cycle to the next */
        if (ctx->currentIndex >= 64) {
            chacha20_round(ctx);
        }

        /* Do the xor while there's some state left and some plaintext left */
        while (ctx->currentIndex < 64 && len) {
            *blk++ ^= ctx->current[ctx->currentIndex++];
            --len;
        }
    }
}